

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Select * __thiscall
wasm::Builder::makeSelect
          (Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse,Type type)

{
  Select *this_00;
  
  this_00 = (Select *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id = SelectId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id = 0;
  this_00->condition = condition;
  this_00->ifTrue = ifTrue;
  this_00->ifFalse = ifFalse;
  Select::finalize(this_00,type);
  return this_00;
}

Assistant:

Select* makeSelect(Expression* condition,
                     Expression* ifTrue,
                     Expression* ifFalse,
                     Type type) {
    auto* ret = wasm.allocator.alloc<Select>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize(type);
    return ret;
  }